

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O1

vorbis_info_floor * floor1_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  ulong uVar2;
  uint *__s;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  vorbis_info_floor1 *info;
  ulong uVar8;
  int iVar9;
  uint *puVar10;
  int iVar11;
  ulong uVar12;
  
  pvVar1 = vi->codec_setup;
  __s = (uint *)calloc(1,0x448);
  lVar3 = oggpack_read(opb,5);
  uVar7 = (uint)lVar3;
  *__s = uVar7;
  if ((int)uVar7 < 1) {
    iVar9 = -1;
  }
  else {
    uVar8 = 0xffffffff;
    uVar12 = 0;
    do {
      uVar4 = oggpack_read(opb,4);
      __s[uVar12 + 1] = (uint)uVar4;
      uVar2 = uVar4 & 0xffffffff;
      if ((int)(uint)uVar4 < (int)uVar8) {
        uVar2 = uVar8;
      }
      uVar8 = uVar2;
      uVar12 = uVar12 + 1;
      iVar9 = (int)uVar8;
    } while ((uVar7 & 0x7fffffff) != uVar12);
  }
  if (-1 < iVar9) {
    puVar10 = __s + 0x50;
    uVar8 = 0;
    do {
      lVar3 = oggpack_read(opb,3);
      __s[uVar8 + 0x20] = (int)lVar3 + 1;
      lVar3 = oggpack_read(opb,2);
      uVar7 = (uint)lVar3;
      __s[uVar8 + 0x30] = uVar7;
      if ((int)uVar7 < 0) {
LAB_001218c6:
        memset(__s,0,0x448);
        free(__s);
        return (vorbis_info_floor *)0x0;
      }
      if (uVar7 != 0) {
        lVar3 = oggpack_read(opb,8);
        __s[uVar8 + 0x40] = (uint)lVar3;
      }
      if (((int)__s[uVar8 + 0x40] < 0) || (*(int *)((long)pvVar1 + 0x24) <= (int)__s[uVar8 + 0x40]))
      goto LAB_001218c6;
      if (__s[uVar8 + 0x30] != 0x1f) {
        lVar3 = 0;
        do {
          lVar5 = oggpack_read(opb,8);
          uVar7 = (uint)lVar5 - 1;
          puVar10[lVar3] = uVar7;
          if ((0x80000000 < (uint)lVar5) || (*(int *)((long)pvVar1 + 0x24) <= (int)uVar7))
          goto LAB_001218c6;
          lVar3 = lVar3 + 1;
        } while (lVar3 < 1 << ((byte)__s[uVar8 + 0x30] & 0x1f));
      }
      uVar8 = uVar8 + 1;
      puVar10 = puVar10 + 8;
    } while (uVar8 != iVar9 + 1);
  }
  lVar3 = oggpack_read(opb,2);
  __s[0xd0] = (int)lVar3 + 1;
  lVar3 = oggpack_read(opb,4);
  if (0 < (int)*__s) {
    lVar5 = 0;
    iVar9 = 0;
    iVar11 = 0;
    do {
      iVar11 = iVar11 + __s[(long)(int)__s[lVar5 + 1] + 0x20];
      if (iVar9 < iVar11) {
        puVar10 = __s + (long)iVar9 + 0xd3;
        do {
          lVar6 = oggpack_read(opb,(int)lVar3);
          uVar7 = (uint)lVar6;
          *puVar10 = uVar7;
          if (((int)uVar7 < 0) || (1 << ((byte)lVar3 & 0x1f) <= (int)uVar7)) goto LAB_001218c6;
          puVar10 = puVar10 + 1;
          iVar9 = iVar9 + 1;
        } while (iVar11 != iVar9);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)*__s);
  }
  __s[0xd1] = 0;
  __s[0xd2] = 1 << ((byte)lVar3 & 0x1f);
  return __s;
}

Assistant:

static vorbis_info_floor *floor1_unpack (vorbis_info *vi,oggpack_buffer *opb){
  codec_setup_info     *ci=(codec_setup_info *)vi->codec_setup;
  int j,k,count=0,maxclass=-1,rangebits;

  vorbis_info_floor1 *info=(vorbis_info_floor1 *)_ogg_calloc(1,sizeof(*info));
  /* read partitions */
  info->partitions=oggpack_read(opb,5); /* only 0 to 31 legal */
  for(j=0;j<info->partitions;j++){
    info->partitionclass[j]=oggpack_read(opb,4); /* only 0 to 15 legal */
    if(maxclass<info->partitionclass[j])maxclass=info->partitionclass[j];
  }

  /* read partition classes */
  for(j=0;j<maxclass+1;j++){
    info->class_dim[j]=oggpack_read(opb,3)+1; /* 1 to 8 */
    info->class_subs[j]=oggpack_read(opb,2); /* 0,1,2,3 bits */
    if(info->class_subs[j]<0)
      goto err_out;
    if(info->class_subs[j])info->class_book[j]=oggpack_read(opb,8);
    if(info->class_book[j]<0 || info->class_book[j]>=ci->books)
      goto err_out;
    for(k=0;k<(1<<info->class_subs[j]);k++){
      info->class_subbook[j][k]=oggpack_read(opb,8)-1;
      if(info->class_subbook[j][k]<-1 || info->class_subbook[j][k]>=ci->books)
	goto err_out;
    }
  }

  /* read the post list */
  info->mult=oggpack_read(opb,2)+1;     /* only 1,2,3,4 legal now */ 
  rangebits=oggpack_read(opb,4);

  for(j=0,k=0;j<info->partitions;j++){
    count+=info->class_dim[info->partitionclass[j]]; 
    for(;k<count;k++){
      int t=info->postlist[k+2]=oggpack_read(opb,rangebits);
      if(t<0 || t>=(1<<rangebits))
	goto err_out;
    }
  }
  info->postlist[0]=0;
  info->postlist[1]=1<<rangebits;

  return(info);
  
 err_out:
  floor1_free_info(info);
  return(NULL);
}